

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  allocator_type allocator;
  Allocator alloc;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *message;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Float FVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  string ret;
  Array2D<float> v;
  AssertionResult gtest_ar;
  double s;
  SummedAreaTable sat;
  Message local_e0;
  uint local_d8;
  int local_d4;
  string local_d0;
  Array2D<float> local_b0;
  double local_90;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  AssertHelper local_70;
  double local_68;
  Bounds2f local_60;
  Array2D<double> local_50;
  
  uVar18 = 0x853c49e6748fea9b;
  local_78 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&DAT_0060eb60 + local_78);
    allocator.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Array2D<float>::Array2D(&local_b0,(int)uVar1,(int)((ulong)uVar1 >> 0x20),allocator);
    if (local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
        local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
      iVar11 = 0;
      uVar9 = local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      do {
        if (0 < (int)uVar9) {
          uVar17 = 0;
          do {
            do {
              uVar8 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
              bVar5 = (byte)(uVar18 >> 0x3b);
              uVar8 = uVar8 >> bVar5 | uVar8 << 0x20 - bVar5;
              uVar18 = uVar18 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
            } while ((int)uVar8 < 0);
            iVar6 = (int)uVar17;
            uVar17 = uVar17 + 1;
            local_b0.values
            [(int)((iVar6 - local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) +
                  (iVar11 - local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar9)] =
                 (float)(uVar8 & 0x1f);
          } while (uVar17 != uVar9);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 != local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                         local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::integrate(&local_50,(SummedAreaTable *)&local_50,&local_b0,alloc);
    iVar11 = 0;
    do {
      uVar9 = local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      do {
        uVar8 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
        bVar5 = (byte)(uVar18 >> 0x3b);
        uVar8 = uVar8 >> bVar5 | uVar8 << 0x20 - bVar5;
        uVar18 = uVar18 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar8 < (int)(-uVar9 % uVar9));
      local_d8 = local_b0.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                 local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      do {
        uVar12 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
        bVar5 = (byte)(uVar18 >> 0x3b);
        uVar12 = uVar12 >> bVar5 | uVar12 << 0x20 - bVar5;
        uVar18 = uVar18 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar12 < (int)(-local_d8 % local_d8));
      uVar8 = (int)uVar8 % (int)uVar9;
      do {
        uVar15 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
        bVar5 = (byte)(uVar18 >> 0x3b);
        uVar15 = uVar15 >> bVar5 | uVar15 << 0x20 - bVar5;
        uVar18 = uVar18 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar15 < (int)(-uVar9 % uVar9));
      uVar17 = (long)(int)uVar12 % (long)(int)local_d8;
      do {
        uVar12 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
        bVar5 = (byte)(uVar18 >> 0x3b);
        uVar12 = uVar12 >> bVar5 | uVar12 << 0x20 - bVar5;
        uVar18 = uVar18 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      } while ((int)uVar12 < (int)(-local_d8 % local_d8));
      uVar15 = (int)uVar15 % (int)uVar9;
      uVar10 = (uint)uVar17;
      uVar14 = (long)(int)uVar12 % (long)(int)local_d8;
      uVar12 = uVar8;
      if ((int)uVar15 < (int)uVar8) {
        uVar12 = uVar15;
      }
      uVar7 = (uint)uVar14;
      auVar23 = vpinsrd_avx(ZEXT416(local_d8),uVar9,1);
      if ((int)uVar7 < (int)uVar10) {
        uVar17 = uVar14;
      }
      uVar14 = uVar17 & 0xffffffff;
      auVar23 = vcvtdq2ps_avx(auVar23);
      if ((int)uVar15 < (int)uVar8) {
        uVar15 = uVar8;
      }
      uVar8 = uVar7;
      if ((int)uVar7 < (int)uVar10) {
        uVar8 = uVar10;
      }
      auVar25._0_8_ = auVar23._0_8_;
      auVar25._8_8_ = auVar25._0_8_;
      auVar23 = vpinsrd_avx(ZEXT416(uVar8),uVar15,1);
      auVar23 = vpinsrd_avx(auVar23,(int)uVar17,2);
      auVar23 = vpinsrd_avx(auVar23,uVar12,3);
      auVar23 = vcvtdq2ps_avx(auVar23);
      auVar23 = vdivps_avx(auVar23,auVar25);
      auVar22 = vshufpd_avx(auVar23,auVar23,1);
      auVar25 = vshufps_avx(auVar23,auVar23,0xff);
      auVar21 = vmovshdup_avx(auVar23);
      uVar17 = vcmpps_avx512vl(auVar23,auVar22,1);
      bVar3 = (byte)(uVar17 >> 2);
      bVar2 = (byte)(uVar17 >> 3);
      bVar5 = (byte)(uVar17 >> 1);
      auVar19._4_12_ = auVar22._4_12_;
      auVar19._0_4_ =
           (uint)((byte)uVar17 & 1) * auVar23._0_4_ +
           (uint)!(bool)((byte)uVar17 & 1) * auVar22._0_4_;
      auVar20._4_12_ = auVar25._4_12_;
      auVar20._0_4_ = (uint)(bVar5 & 1) * auVar21._0_4_ + (uint)!(bool)(bVar5 & 1) * auVar25._0_4_;
      auVar21._0_4_ = (uint)(bVar2 & 1) * auVar21._0_4_ + (uint)!(bool)(bVar2 & 1) * auVar25._0_4_;
      auVar21._4_12_ = auVar20._4_12_;
      auVar22._0_4_ = (uint)(bVar3 & 1) * auVar23._0_4_ + (uint)!(bool)(bVar3 & 1) * auVar22._0_4_;
      auVar22._4_12_ = auVar19._4_12_;
      auVar23 = vinsertps_avx(auVar20,auVar19,0x10);
      auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
      local_60 = (Bounds2f)vmovlhps_avx(auVar23,auVar21);
      auVar27 = ZEXT864(0) << 0x20;
      local_90 = 0.0;
      if (((int)uVar12 < (int)uVar15) && (uVar10 != uVar7)) {
        uVar17 = (ulong)uVar12;
        uVar16 = uVar14 << 0x20;
        do {
          iVar13 = (int)uVar14;
          iVar6 = (int)uVar17;
          uVar10 = iVar6 + 1;
          uVar17 = (uVar16 & 0xffffffff00000000 | (ulong)uVar12) + 0x100000000;
          if (uVar10 != uVar15) {
            uVar17 = (ulong)uVar10 + (uVar16 & 0xffffffff00000000);
          }
          uVar14 = uVar17 >> 0x20;
          local_90 = auVar27._0_8_ +
                     (double)local_b0.values
                             [(int)((iVar13 - local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y
                                    ) * uVar9 +
                                   (iVar6 - local_b0.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x))
                             ];
          auVar27 = ZEXT864((ulong)local_90);
          uVar16 = uVar17;
        } while ((uVar12 != (uint)uVar17) || (uVar8 != (uint)(uVar17 >> 0x20)));
      }
      local_90 = local_90 / (double)(int)(local_d8 * uVar9);
      local_d4 = iVar11;
      FVar24 = pbrt::SummedAreaTable::Sum((SummedAreaTable *)&local_50,&local_60);
      local_68 = (double)FVar24;
      if ((local_90 != local_68) || (NAN(local_90) || NAN(local_68))) {
        local_e0.ss_.ptr_._0_4_ = 0x3a83126f;
        auVar26._0_8_ = (local_90 - local_68) / local_90;
        auVar26._8_8_ = 0;
        auVar23._8_8_ = 0x7fffffffffffffff;
        auVar23._0_8_ = 0x7fffffffffffffff;
        auVar23 = vandpd_avx512vl(auVar26,auVar23);
        local_d0._M_dataplus._M_p = (pointer)vmovlpd_avx(auVar23);
        testing::internal::CmpHelperLT<double,float>
                  (local_88,"std::abs((ref - s) / ref)","1e-3f",(double *)&local_d0,
                   (float *)&local_e0);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message(&local_e0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          pbrt::detail::stringPrintfRecursive<double&,double&>
                    (&local_d0,"ref %f s %f",&local_90,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) + 0x10),
                     local_d0._M_dataplus._M_p,local_d0._M_string_length);
          message = "";
          if (local_80.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            message = ((local_80.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x528,message);
          testing::internal::AssertHelper::operator=(&local_70,&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if (CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != 0) {
            bVar4 = testing::internal::IsTrue(true);
            if ((bVar4) &&
               ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      iVar11 = local_d4 + 1;
    } while (iVar11 != 100);
    pbrt::Array2D<double>::~Array2D(&local_50);
    pbrt::Array2D<float>::~Array2D(&local_b0);
    local_78 = local_78 + 8;
  } while (local_78 != 0x30);
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Sum(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}